

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core-C-API.cpp
# Opt level: O3

llb_buildengine_t * llb_buildengine_create(llb_buildengine_delegate_t delegate)

{
  llb_buildengine_t *plVar1;
  BuildEngineDelegate *delegate_00;
  BuildEngine *this;
  pointer __p;
  _func_int **in_stack_00000008;
  _func_int **in_stack_00000010;
  _func_int **in_stack_00000018;
  _func_int **in_stack_00000020;
  _func_int **in_stack_00000028;
  __uniq_ptr_impl<llbuild::core::BuildEngine,_std::default_delete<llbuild::core::BuildEngine>_>
  local_30;
  
  plVar1 = (llb_buildengine_t *)operator_new(0x10);
  *(undefined8 *)(plVar1 + 8) = 0;
  delegate_00 = (BuildEngineDelegate *)operator_new(0x38);
  delegate_00[2]._vptr_BuildEngineDelegate = in_stack_00000008;
  delegate_00[3]._vptr_BuildEngineDelegate = in_stack_00000010;
  delegate_00[4]._vptr_BuildEngineDelegate = in_stack_00000018;
  delegate_00[5]._vptr_BuildEngineDelegate = in_stack_00000020;
  delegate_00[6]._vptr_BuildEngineDelegate = in_stack_00000028;
  delegate_00->_vptr_BuildEngineDelegate = (_func_int **)&PTR__CAPIBuildEngineDelegate_0023b390;
  delegate_00[1]._vptr_BuildEngineDelegate = (_func_int **)&PTR__CAPIBuildEngineDelegate_0023b410;
  *(BuildEngineDelegate **)plVar1 = delegate_00;
  this = (BuildEngine *)operator_new(8);
  llbuild::core::BuildEngine::BuildEngine(this,delegate_00);
  local_30._M_t.
  super__Tuple_impl<0UL,_llbuild::core::BuildEngine_*,_std::default_delete<llbuild::core::BuildEngine>_>
  .super__Head_base<0UL,_llbuild::core::BuildEngine_*,_false>._M_head_impl =
       (tuple<llbuild::core::BuildEngine_*,_std::default_delete<llbuild::core::BuildEngine>_>)
       (_Tuple_impl<0UL,_llbuild::core::BuildEngine_*,_std::default_delete<llbuild::core::BuildEngine>_>
        )0x0;
  std::__uniq_ptr_impl<llbuild::core::BuildEngine,_std::default_delete<llbuild::core::BuildEngine>_>
  ::reset((__uniq_ptr_impl<llbuild::core::BuildEngine,_std::default_delete<llbuild::core::BuildEngine>_>
           *)(plVar1 + 8),this);
  std::unique_ptr<llbuild::core::BuildEngine,_std::default_delete<llbuild::core::BuildEngine>_>::
  ~unique_ptr((unique_ptr<llbuild::core::BuildEngine,_std::default_delete<llbuild::core::BuildEngine>_>
               *)&local_30);
  return plVar1;
}

Assistant:

llb_buildengine_t* llb_buildengine_create(llb_buildengine_delegate_t delegate) {
  CAPIBuildEngine* capi_engine = new CAPIBuildEngine;
  capi_engine->delegate = std::unique_ptr<BuildEngineDelegate>(
    new CAPIBuildEngineDelegate(delegate));
  capi_engine->engine = std::unique_ptr<BuildEngine>(
    new BuildEngine(*capi_engine->delegate));
  return (llb_buildengine_t*) capi_engine;
}